

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O1

void __thiscall
HoldingProperty_MoveFrom_Test::~HoldingProperty_MoveFrom_Test(HoldingProperty_MoveFrom_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HoldingProperty, MoveFrom)
{
  HoldingMovableType obj;

  // can't move from returned value
  auto remembered_value = obj.value1().getId();
  Movable move_to = std::move( obj.value1() );
  EXPECT_NE( remembered_value, move_to.getId() );
  EXPECT_NE( 0, obj.value1().getId() );
  
  // can't move from returned value
  remembered_value = obj.ro_value().getId();
  Movable move_to4 = std::move( obj.ro_value() );
  EXPECT_NE( remembered_value, move_to4.getId() );
  EXPECT_NE( 0, obj.ro_value().getId() );
  
#if MOVE_CAST_SUPPORTED

  remembered_value = obj.value1().getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_EQ( remembered_value, move_to2.getId() );
  EXPECT_EQ( 0, obj.value1().getId() );
  
  remembered_value = obj.ro_value().getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_EQ( remembered_value, move_to3.getId() );
  EXPECT_EQ( 0, obj.ro_value().getId() );

#else

  remembered_value = obj.value1().getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_NE( remembered_value, move_to2.getId() );
  EXPECT_NE( 0, obj.value1().getId() );

  remembered_value = obj.ro_value().getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_NE( remembered_value, move_to3.getId() );
  EXPECT_NE( 0, obj.ro_value().getId() );

#endif
}